

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableHeadersRow(void)

{
  ImGuiTable *table;
  ImVec2 IVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *label;
  float row_min_height;
  float fStack_54;
  float fStack_44;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    __assert_fail("table != __null && \"Need to call TableHeadersRow() after BeginTable()!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui_tables.cpp"
                  ,0xb05,"void ImGui::TableHeadersRow()");
  }
  if (table->IsLayoutLocked == false) {
    TableUpdateLayout(table);
  }
  IVar1 = GetCursorScreenPos();
  row_min_height = TableGetHeaderRowHeight();
  TableNextRow(1,row_min_height);
  if (table->HostSkipItems == false) {
    fStack_54 = IVar1.y;
    iVar4 = 0;
    iVar5 = 0;
    if (GImGui->CurrentTable != (ImGuiTable *)0x0) {
      iVar5 = GImGui->CurrentTable->ColumnsCount;
    }
    iVar6 = 0;
    if (0 < iVar5) {
      iVar6 = iVar5;
    }
    for (; iVar6 != iVar4; iVar4 = iVar4 + 1) {
      bVar2 = TableSetColumnIndex(iVar4);
      if (bVar2) {
        uVar3 = TableGetColumnFlags(iVar4);
        label = "";
        if ((uVar3 >> 0xc & 1) == 0) {
          label = TableGetColumnName(iVar4);
        }
        PushID((int)table->InstanceCurrent * table->ColumnsCount + iVar4);
        TableHeader(label);
        PopID();
      }
    }
    IVar1 = GetMousePos();
    bVar2 = IsMouseReleased(1);
    if (bVar2) {
      if (GImGui->CurrentTable == (ImGuiTable *)0x0) {
        iVar4 = -1;
      }
      else {
        iVar4 = (int)GImGui->CurrentTable->HoveredColumnBody;
      }
      if (((iVar4 == iVar5) && (fStack_44 = IVar1.y, fStack_54 <= fStack_44)) &&
         (fStack_44 < fStack_54 + row_min_height)) {
        TableOpenContextMenu(-1);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::TableHeadersRow()
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    IM_ASSERT(table != NULL && "Need to call TableHeadersRow() after BeginTable()!");

    // Layout if not already done (this is automatically done by TableNextRow, we do it here solely to facilitate stepping in debugger as it is frequent to step in TableUpdateLayout)
    if (!table->IsLayoutLocked)
        TableUpdateLayout(table);

    // Open row
    const float row_y1 = GetCursorScreenPos().y;
    const float row_height = TableGetHeaderRowHeight();
    TableNextRow(ImGuiTableRowFlags_Headers, row_height);
    if (table->HostSkipItems) // Merely an optimization, you may skip in your own code.
        return;

    const int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
    {
        if (!TableSetColumnIndex(column_n))
            continue;

        // Push an id to allow unnamed labels (generally accidental, but let's behave nicely with them)
        // - in your own code you may omit the PushID/PopID all-together, provided you know they won't collide
        // - table->InstanceCurrent is only >0 when we use multiple BeginTable/EndTable calls with same identifier.
        const char* name = (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_NoHeaderLabel) ? "" : TableGetColumnName(column_n);
        PushID(table->InstanceCurrent * table->ColumnsCount + column_n);
        TableHeader(name);
        PopID();
    }

    // Allow opening popup from the right-most section after the last column.
    ImVec2 mouse_pos = ImGui::GetMousePos();
    if (IsMouseReleased(1) && TableGetHoveredColumn() == columns_count)
        if (mouse_pos.y >= row_y1 && mouse_pos.y < row_y1 + row_height)
            TableOpenContextMenu(-1); // Will open a non-column-specific popup.
}